

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_encoded_array_item_size(AMQP_VALUE item,size_t *encoded_size)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  size_t *encoded_size_local;
  AMQP_VALUE item_local;
  
  if ((item == (AMQP_VALUE)0x0) || (encoded_size == (size_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_array_item_size",0x12b3,1,
                "Bad arguments: item = %p, encoded_size = %p",item,encoded_size);
    }
    l._4_4_ = 0x12b4;
  }
  else {
    *encoded_size = 0;
    l._4_4_ = amqpvalue_encode_array_item(item,false,count_bytes,encoded_size);
  }
  return l._4_4_;
}

Assistant:

static int amqpvalue_get_encoded_array_item_size(AMQP_VALUE item, size_t* encoded_size)
{
    int result;

    if ((item == NULL) ||
        (encoded_size == NULL))
    {
        LogError("Bad arguments: item = %p, encoded_size = %p", item, encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;
        result = amqpvalue_encode_array_item(item, false, count_bytes, encoded_size);
    }

    return result;
}